

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

void do_scroll_short_agg_proc(Am_Object param_1)

{
  Am_Value *pAVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = get_long_short_ratio_x();
  fVar4 = get_long_short_ratio_y();
  pAVar1 = (Am_Value *)Am_Object::Get(0xe428,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar1);
  Am_Object::Set(0xe3d8,0x11d,(ulong)(uint)(int)((float)iVar2 / fVar3));
  pAVar1 = (Am_Value *)Am_Object::Get(0xe428,0x65);
  iVar2 = Am_Value::operator_cast_to_int(pAVar1);
  Am_Object::Set(0xe3d8,0x11e,(ulong)(uint)(int)((float)iVar2 / fVar4));
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_scroll_short_agg,
                 (Am_Object /* command */))
{
  float ratio_x = get_long_short_ratio_x();
  float ratio_y = get_long_short_ratio_y();

  //constraints set the SP_Short_Agg based on the scroll bars
  SP_Scroll_Agg.Set(Am_X_OFFSET,
                    (int)((int)(SP_Long_Feed.Get(Am_LEFT)) / ratio_x));
  SP_Scroll_Agg.Set(Am_Y_OFFSET,
                    (int)((int)(SP_Long_Feed.Get(Am_TOP)) / ratio_y));
}